

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,Pubkey *pubkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *this_00;
  string local_70;
  ByteData256 *local_50;
  ByteData160 local_48;
  
  local_50 = chain_code;
  HashUtil::Hash160(&local_48,parent_key);
  ByteData160::GetData((ByteData *)&local_70,&local_48);
  ExtPubkey(this,network_type,(ByteData *)&local_70,pubkey,local_50,depth,child_num);
  if (local_70._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar1 = Pubkey::IsValid(parent_key);
  if (bVar1) {
    return;
  }
  local_70._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_70._M_string_length._0_4_ = 0x375;
  local_70.field_2._M_allocated_capacity = (long)"CfdCreateExtPubkey" + 9;
  logger::log<>((CfdSourceLocation *)&local_70,kCfdLogLevelWarning,"invalid pubkey.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Failed to pubkey. ExtPubkey invalid pubkey.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_70);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key, const Pubkey& pubkey,
    const ByteData256& chain_code, uint8_t depth, uint32_t child_num)
    : ExtPubkey(
          network_type, HashUtil::Hash160(parent_key).GetData(), pubkey,
          chain_code, depth, child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
}